

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_image_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  __cxx11 local_2f0 [32];
  __cxx11 local_2d0 [32];
  __cxx11 local_2b0 [32];
  __cxx11 local_290 [32];
  __cxx11 local_270 [32];
  __cxx11 local_250 [32];
  __cxx11 local_230 [32];
  __cxx11 local_210 [32];
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [55];
  undefined1 local_11;
  string *str;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.stype : ");
  to_string_abi_cxx11_((ze_structure_type_t)local_48);
  std::__cxx11::string::operator+=(in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.pNext : ");
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  std::ostream::operator<<(poVar1,val._0_8_);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=(in_RDI,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxImageDims1D : ");
  std::__cxx11::to_string(local_210,(uint)val.pNext);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxImageDims2D : ");
  std::__cxx11::to_string(local_230,val.pNext._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxImageDims3D : ");
  std::__cxx11::to_string(local_250,val.maxImageDims1D);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxImageBufferSize : ");
  std::__cxx11::to_string(local_270,val._24_8_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxImageArraySlices : ");
  std::__cxx11::to_string(local_290,(uint)val.maxImageBufferSize);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxSamplers : ");
  std::__cxx11::to_string(local_2b0,val.maxImageBufferSize._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxReadImageArgs : ");
  std::__cxx11::to_string(local_2d0,val.maxImageArraySlices);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_image_properties_t.maxWriteImageArgs : ");
  std::__cxx11::to_string(local_2f0,val.maxSamplers);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  return in_RDI;
}

Assistant:

std::string to_string( ze_device_image_properties_t val )
{
    std::string str;
    
    str += "ze_device_image_properties_t.stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "ze_device_image_properties_t.pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims1D : ";
    str += std::to_string(val.maxImageDims1D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims2D : ";
    str += std::to_string(val.maxImageDims2D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims3D : ";
    str += std::to_string(val.maxImageDims3D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageBufferSize : ";
    str += std::to_string(val.maxImageBufferSize);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageArraySlices : ";
    str += std::to_string(val.maxImageArraySlices);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxSamplers : ";
    str += std::to_string(val.maxSamplers);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxReadImageArgs : ";
    str += std::to_string(val.maxReadImageArgs);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxWriteImageArgs : ";
    str += std::to_string(val.maxWriteImageArgs);
    str += "\n";

    return str;
}